

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyTable.c
# Opt level: O0

void Ivy_TableUpdate(Ivy_Man_t *p,Ivy_Obj_t *pObj,int ObjIdNew)

{
  int iVar1;
  int *piVar2;
  int *pPlace;
  int ObjIdNew_local;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  iVar1 = Ivy_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyTable.c"
                  ,0xa8,"void Ivy_TableUpdate(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  iVar1 = Ivy_ObjIsHash(pObj);
  if (iVar1 != 0) {
    piVar2 = Ivy_TableFind(p,pObj);
    if (*piVar2 != pObj->Id) {
      __assert_fail("*pPlace == pObj->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyTable.c"
                    ,0xac,"void Ivy_TableUpdate(Ivy_Man_t *, Ivy_Obj_t *, int)");
    }
    *piVar2 = ObjIdNew;
  }
  return;
}

Assistant:

void Ivy_TableUpdate( Ivy_Man_t * p, Ivy_Obj_t * pObj, int ObjIdNew )
{
    int * pPlace;
    assert( !Ivy_IsComplement(pObj) );
    if ( !Ivy_ObjIsHash(pObj) )
        return;
    pPlace = Ivy_TableFind( p, pObj );
    assert( *pPlace == pObj->Id ); // node should be in the table
    *pPlace = ObjIdNew; 
}